

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard.cpp
# Opt level: O2

void __thiscall gepard::Gepard::~Gepard(Gepard *this)

{
  GepardEngine *this_00;
  
  this_00 = this->_engine;
  if (this_00 != (GepardEngine *)0x0) {
    GepardEngine::~GepardEngine(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)&(this->strokeStyle).data);
  std::__cxx11::string::~string((string *)&(this->fillStyle).data);
  std::__cxx11::string::~string((string *)&(this->miterLimit).data);
  std::__cxx11::string::~string((string *)&(this->lineJoin).data);
  std::__cxx11::string::~string((string *)&(this->lineCap).data);
  std::__cxx11::string::~string((string *)&(this->lineWidth).data);
  return;
}

Assistant:

Gepard::~Gepard()
{
    if (_engine) {
        delete _engine;
    }
}